

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O2

RunResult __thiscall wabt::interp::Thread::DoTableSize(Thread *this,Instr instr)

{
  RefPtr<wabt::interp::Table> local_28;
  
  RefPtr<wabt::interp::Table>::RefPtr
            (&local_28,this->store_,
             (Ref)(this->inst_->tables_).
                  super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                  super__Vector_impl_data._M_start[instr.field_2.imm_u32].index);
  Push<unsigned_int>(this,(uint)((ulong)((long)((local_28.obj_)->elements_).
                                               super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>
                                               ._M_impl.super__Vector_impl_data._M_finish -
                                        (long)((local_28.obj_)->elements_).
                                              super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>
                                              ._M_impl.super__Vector_impl_data._M_start) >> 3));
  RefPtr<wabt::interp::Table>::reset(&local_28);
  return Ok;
}

Assistant:

RunResult Thread::DoTableSize(Instr instr) {
  Table::Ptr table{store_, inst_->tables()[instr.imm_u32]};
  Push<u32>(table->size());
  return RunResult::Ok;
}